

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_strategies.cpp
# Opt level: O0

uint32 __thiscall Clasp::ReduceParams::getBase(ReduceParams *this,SharedContext *ctx)

{
  bool bVar1;
  StatsCRef pPVar2;
  StatsCRef pPVar3;
  uint *puVar4;
  SharedContext *in_RSI;
  long in_RDI;
  uint32 M;
  uint32 m;
  uint32 st;
  uint local_5c;
  uint local_3c;
  uint32 local_2c [2];
  uint32 local_24;
  uint local_20;
  uint local_1c;
  SharedContext *local_18;
  uint local_4;
  
  local_18 = in_RSI;
  if (((*(uint *)(in_RDI + 0x20) >> 0x1d & 3) != 0) ||
     (bVar1 = SharedContext::isExtended(in_RSI), bVar1)) {
    local_3c = *(uint *)(in_RDI + 0x20) >> 0x1d & 3;
  }
  else {
    local_3c = 2;
  }
  local_1c = local_3c;
  switch(local_3c) {
  default:
    pPVar2 = SharedContext::stats(local_18);
    pPVar3 = SharedContext::stats(local_18);
    local_24 = ProblemStats::numConstraints(pPVar3);
    puVar4 = std::min<unsigned_int>((uint *)pPVar2,&local_24);
    local_20 = *puVar4;
    pPVar2 = SharedContext::stats(local_18);
    pPVar3 = SharedContext::stats(local_18);
    local_2c[0] = ProblemStats::numConstraints(pPVar3);
    puVar4 = std::max<unsigned_int>((uint *)pPVar2,local_2c);
    local_5c = *puVar4;
    if (local_5c <= local_20 * 10) {
      local_5c = local_20;
    }
    local_4 = local_5c;
    break;
  case 1:
    pPVar2 = SharedContext::stats(local_18);
    local_4 = pPVar2->complexity;
    break;
  case 2:
    pPVar2 = SharedContext::stats(local_18);
    local_4 = ProblemStats::numConstraints(pPVar2);
    break;
  case 3:
    pPVar2 = SharedContext::stats(local_18);
    local_4 = (pPVar2->vars).num;
  }
  return local_4;
}

Assistant:

uint32 ReduceParams::getBase(const SharedContext& ctx) const {
	uint32 st = strategy.estimate != ReduceStrategy::est_dynamic || ctx.isExtended() ? strategy.estimate : (uint32)ReduceStrategy::est_num_constraints;
	switch(st) {
		default:
		case ReduceStrategy::est_dynamic        : {
			uint32 m = std::min(ctx.stats().vars.num, ctx.stats().numConstraints());
			uint32 M = std::max(ctx.stats().vars.num, ctx.stats().numConstraints());
			return M > (m * 10) ? M : m;
		}
		case ReduceStrategy::est_con_complexity : return ctx.stats().complexity;
		case ReduceStrategy::est_num_constraints: return ctx.stats().numConstraints();
		case ReduceStrategy::est_num_vars       : return ctx.stats().vars.num;
	}
}